

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  int *piVar1;
  int iVar2;
  const_reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  int *piVar6;
  reference pvVar7;
  size_type sVar8;
  byte *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  long *in_RSI;
  void *in_R8;
  bool bVar9;
  int bottom_blob_index_2;
  size_t i_3;
  int top_blob_index_2;
  size_t i_2;
  int ret_5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  int top_blob_index_1;
  size_t i_1;
  int ret_4;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs;
  int ret_3;
  Mat *bottom_blob_ref_1;
  int bottom_blob_index_1;
  size_t i;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  int ret_2;
  Mat top_blob;
  int ret_1;
  Mat *bottom_top_blob;
  int ret;
  Mat bottom_blob;
  Mat *bottom_blob_ref;
  int top_blob_index;
  int bottom_blob_index;
  reference in_stack_fffffffffffff910;
  size_type in_stack_fffffffffffff918;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffff920;
  ulong local_558;
  ulong local_548;
  undefined1 local_538 [16];
  pointer in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  value_type vVar10;
  Mat *in_stack_fffffffffffffae8;
  ulong uVar11;
  ulong __n;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  Mat local_4f8;
  reference local_4b0;
  int local_4a4;
  int *local_4a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_490;
  int local_474;
  value_type local_470;
  int local_424;
  reference local_420;
  int local_414;
  int local_410;
  Mat local_400;
  value_type local_3b8;
  reference local_370;
  value_type local_368;
  int local_364;
  byte *local_360;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_358;
  long *local_350;
  int local_33c;
  value_type *local_338;
  value_type *local_330;
  int local_328;
  undefined4 local_324;
  reference local_320;
  reference local_318;
  reference local_310;
  int local_308;
  undefined4 local_304;
  reference local_300;
  reference local_2f8;
  reference local_2f0;
  int local_2e8;
  undefined4 local_2e4;
  reference local_2e0;
  reference local_2d8;
  reference local_2d0;
  int local_2c8;
  undefined4 local_2c4;
  reference local_2c0;
  reference local_2b8;
  reference local_2b0;
  int local_2a8;
  undefined4 local_2a4;
  reference local_2a0;
  reference local_298;
  reference local_290;
  int local_288;
  undefined4 local_284;
  reference local_280;
  reference local_278;
  reference local_270;
  int local_268;
  undefined4 local_264;
  reference local_260;
  reference local_258;
  reference local_250;
  int local_248;
  undefined4 local_244;
  value_type *local_240;
  value_type *local_238;
  value_type *local_230;
  Mat *local_228;
  value_type *local_218;
  value_type *local_208;
  Mat *local_1f8;
  reference local_1e8;
  value_type *local_1e0;
  int local_1c8;
  undefined4 local_1c4;
  Mat *local_1c0;
  int local_1a8;
  undefined4 local_1a4;
  value_type *local_1a0;
  int local_188;
  undefined4 local_184;
  value_type *local_180;
  int local_168;
  undefined4 local_164;
  Mat *local_160;
  int local_158;
  undefined4 local_154;
  value_type *local_150;
  int local_148;
  undefined4 local_144;
  reference local_140;
  int local_138;
  undefined4 local_134;
  reference local_130;
  int local_128;
  undefined4 local_124;
  reference local_120;
  int local_118;
  undefined4 local_114;
  reference local_110;
  int local_108;
  undefined4 local_104;
  reference local_100;
  int local_f8;
  undefined4 local_f4;
  reference local_f0;
  int local_e8;
  undefined4 local_e4;
  reference local_e0;
  int local_d8;
  undefined4 local_d4;
  reference local_d0;
  int local_c8;
  undefined4 local_c4;
  reference local_c0;
  int local_b8;
  undefined4 local_b4;
  reference local_b0;
  value_type *local_a8;
  reference local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_30;
  void *local_20;
  void *local_10;
  
  local_360 = in_RCX;
  local_358 = in_RDX;
  local_350 = in_RSI;
  if ((*(byte *)(in_RSI + 1) & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::size
              ((vector<int,_std::allocator<int>_> *)(in_RSI + 0xe));
    std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x178fd6);
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              (in_stack_fffffffffffff920,in_stack_fffffffffffff918,
               (allocator_type *)in_stack_fffffffffffff910);
    std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x179002);
    for (local_4a0 = (int *)0x0; piVar1 = local_4a0,
        piVar6 = (int *)std::vector<int,_std::allocator<int>_>::size
                                  ((vector<int,_std::allocator<int>_> *)(local_350 + 0xe)),
        piVar1 < piVar6; local_4a0 = (int *)((long)local_4a0 + 1)) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_350 + 0xe),
                          (size_type)local_4a0);
      local_4a4 = *pvVar3;
      local_4b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_358,(long)local_4a4);
      pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (&local_490,(size_type)local_4a0);
      local_c0 = pvVar5;
      if (pvVar5->refcount != (int *)0x0) {
        piVar6 = pvVar5->refcount;
        local_c4 = 0xffffffff;
        LOCK();
        local_c8 = *piVar6;
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (local_c8 == 1) {
          if (pvVar5->allocator == (Allocator *)0x0) {
            local_90 = pvVar5->data;
            if (local_90 != (void *)0x0) {
              free(local_90);
            }
          }
          else {
            (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
          }
        }
      }
      pvVar5->data = (void *)0x0;
      pvVar5->elemsize = 0;
      pvVar5->elempack = 0;
      pvVar5->dims = 0;
      pvVar5->w = 0;
      pvVar5->h = 0;
      pvVar5->d = 0;
      pvVar5->c = 0;
      pvVar5->cstep = 0;
      pvVar5->refcount = (int *)0x0;
      if ((((*local_360 & 1) != 0) && ((*(byte *)((long)local_350 + 9) & 1) != 0)) &&
         (*local_4b0->refcount != 1)) {
        Mat::clone(&local_4f8,(__fn *)local_4b0,*(void **)(local_360 + 8),(int)piVar6,in_R8);
        pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           (&local_490,(size_type)local_4a0);
        local_2c0 = &local_4f8;
        local_2b8 = pvVar5;
        if (pvVar5 != local_2c0) {
          if (local_4f8.refcount != (int *)0x0) {
            local_2c4 = 1;
            LOCK();
            local_2c8 = *local_4f8.refcount;
            *local_4f8.refcount = *local_4f8.refcount + 1;
            UNLOCK();
          }
          local_110 = pvVar5;
          if (pvVar5->refcount != (int *)0x0) {
            piVar6 = pvVar5->refcount;
            local_114 = 0xffffffff;
            LOCK();
            local_118 = *piVar6;
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (local_118 == 1) {
              if (pvVar5->allocator == (Allocator *)0x0) {
                local_68 = pvVar5->data;
                if (local_68 != (void *)0x0) {
                  free(local_68);
                }
              }
              else {
                (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
              }
            }
          }
          pvVar5->data = (void *)0x0;
          pvVar5->elemsize = 0;
          pvVar5->elempack = 0;
          pvVar5->dims = 0;
          pvVar5->w = 0;
          pvVar5->h = 0;
          pvVar5->d = 0;
          pvVar5->c = 0;
          pvVar5->cstep = 0;
          pvVar5->refcount = (int *)0x0;
          pvVar5->data = local_2c0->data;
          pvVar5->refcount = local_2c0->refcount;
          pvVar5->elemsize = local_2c0->elemsize;
          pvVar5->elempack = local_2c0->elempack;
          pvVar5->allocator = local_2c0->allocator;
          pvVar5->dims = local_2c0->dims;
          pvVar5->w = local_2c0->w;
          pvVar5->h = local_2c0->h;
          pvVar5->d = local_2c0->d;
          pvVar5->c = local_2c0->c;
          pvVar5->cstep = local_2c0->cstep;
        }
        local_1f8 = &local_4f8;
        local_2b0 = pvVar5;
        local_1c0 = local_1f8;
        if (local_4f8.refcount != (int *)0x0) {
          local_1c4 = 0xffffffff;
          LOCK();
          local_1c8 = *local_4f8.refcount;
          *local_4f8.refcount = *local_4f8.refcount + -1;
          UNLOCK();
          if (local_1c8 == 1) {
            if (local_4f8.allocator == (Allocator *)0x0) {
              local_10 = local_4f8.data;
              if (local_4f8.data != (void *)0x0) {
                free(local_4f8.data);
              }
            }
            else {
              (*(local_4f8.allocator)->_vptr_Allocator[3])(local_4f8.allocator,local_4f8.data);
            }
          }
        }
        local_4f8.data = (void *)0x0;
        local_4f8.elemsize = 0;
        local_4f8.elempack = 0;
        local_4f8.dims = 0;
        local_4f8.w = 0;
        local_4f8.h = 0;
        local_4f8.d = 0;
        local_4f8.c = 0;
        local_4f8.cstep = 0;
        local_4f8.refcount = (int *)0x0;
        local_1e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (&local_490,(size_type)local_4a0);
        bVar9 = true;
        if (local_1e8->data != (void *)0x0) {
          bVar9 = local_1e8->cstep * (long)local_1e8->c == 0;
          local_a0 = local_1e8;
        }
        if (bVar9) {
          local_33c = -100;
          local_410 = 1;
          goto LAB_0017a36d;
        }
      }
      pvVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         (&local_490,(size_type)local_4a0);
      pvVar5 = local_4b0;
      pvVar4 = local_2d0;
      if (pvVar7->dims == 0) {
        pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           (&local_490,(size_type)local_4a0);
        local_2e0 = pvVar5;
        local_2d8 = pvVar4;
        if (pvVar4 != pvVar5) {
          if (pvVar5->refcount != (int *)0x0) {
            piVar6 = pvVar5->refcount;
            local_2e4 = 1;
            LOCK();
            local_2e8 = *piVar6;
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          local_100 = pvVar4;
          if (pvVar4->refcount != (int *)0x0) {
            piVar6 = pvVar4->refcount;
            local_104 = 0xffffffff;
            LOCK();
            local_108 = *piVar6;
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (local_108 == 1) {
              if (pvVar4->allocator == (Allocator *)0x0) {
                local_70 = pvVar4->data;
                if (local_70 != (void *)0x0) {
                  free(local_70);
                }
              }
              else {
                (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
              }
            }
          }
          pvVar4->data = (void *)0x0;
          pvVar4->elemsize = 0;
          pvVar4->elempack = 0;
          pvVar4->dims = 0;
          pvVar4->w = 0;
          pvVar4->h = 0;
          pvVar4->d = 0;
          pvVar4->c = 0;
          pvVar4->cstep = 0;
          pvVar4->refcount = (int *)0x0;
          pvVar4->data = local_2e0->data;
          pvVar4->refcount = local_2e0->refcount;
          pvVar4->elemsize = local_2e0->elemsize;
          pvVar4->elempack = local_2e0->elempack;
          pvVar4->allocator = local_2e0->allocator;
          pvVar4->dims = local_2e0->dims;
          pvVar4->w = local_2e0->w;
          pvVar4->h = local_2e0->h;
          pvVar4->d = local_2e0->d;
          pvVar4->c = local_2e0->c;
          pvVar4->cstep = local_2e0->cstep;
        }
      }
      local_2d0 = pvVar4;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                (&local_490,(size_type)local_4a0);
      iVar2 = convert_layout((NetPrivate *)
                             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                             in_stack_fffffffffffffae8,
                             (Layer *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                             (Option *)in_stack_fffffffffffffad8);
      if (iVar2 != 0) {
        local_410 = 1;
        local_33c = iVar2;
        goto LAB_0017a36d;
      }
    }
    if (((*local_360 & 1) == 0) || ((*(byte *)((long)local_350 + 9) & 1) == 0)) {
      std::vector<int,_std::allocator<int>_>::size
                ((vector<int,_std::allocator<int>_> *)(local_350 + 0x11));
      std::allocator<ncnn::Mat>::allocator((allocator<ncnn::Mat> *)0x179e0b);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                (in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                 (allocator_type *)in_stack_fffffffffffff910);
      std::allocator<ncnn::Mat>::~allocator((allocator<ncnn::Mat> *)0x179e31);
      iVar2 = (**(code **)(*local_350 + 0x30))(local_350,&local_490,local_538,local_360);
      if (iVar2 == 0) {
        for (local_548 = 0;
            sVar8 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)(local_350 + 0x11)),
            local_548 < sVar8; local_548 = local_548 + 1) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_350 + 0x11),local_548);
          iVar2 = *pvVar3;
          pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_538,local_548);
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (local_358,(long)iVar2);
          local_320 = pvVar4;
          local_318 = pvVar5;
          if (pvVar5 != pvVar4) {
            if (pvVar4->refcount != (int *)0x0) {
              piVar6 = pvVar4->refcount;
              local_324 = 1;
              LOCK();
              local_328 = *piVar6;
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            pvVar4 = pvVar5;
            local_e0 = pvVar5;
            if (pvVar5->refcount != (int *)0x0) {
              piVar6 = pvVar5->refcount;
              local_e4 = 0xffffffff;
              LOCK();
              local_e8 = *piVar6;
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (local_e8 == 1) {
                if (pvVar5->allocator == (Allocator *)0x0) {
                  local_80 = pvVar5->data;
                  if (local_80 != (void *)0x0) {
                    free(local_80);
                  }
                }
                else {
                  (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                }
              }
            }
            pvVar5->data = (void *)0x0;
            pvVar5->elemsize = 0;
            pvVar5->elempack = 0;
            pvVar5->dims = 0;
            pvVar5->w = 0;
            pvVar5->h = 0;
            pvVar5->d = 0;
            pvVar5->c = 0;
            pvVar5->cstep = 0;
            pvVar5->refcount = (int *)0x0;
            pvVar4->data = local_320->data;
            pvVar4->refcount = local_320->refcount;
            pvVar4->elemsize = local_320->elemsize;
            pvVar4->elempack = local_320->elempack;
            pvVar4->allocator = local_320->allocator;
            pvVar4->dims = local_320->dims;
            pvVar4->w = local_320->w;
            pvVar4->h = local_320->h;
            pvVar4->d = local_320->d;
            pvVar4->c = local_320->c;
            pvVar4->cstep = local_320->cstep;
            in_stack_fffffffffffff910 = pvVar5;
            pvVar5 = pvVar4;
          }
          local_310 = pvVar5;
        }
        local_410 = 0;
      }
      else {
        local_410 = 1;
        local_33c = iVar2;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff910);
      if (local_410 == 0) goto LAB_0017a1d3;
    }
    else {
      iVar2 = (**(code **)(*local_350 + 0x40))(local_350,&local_490,local_360);
      if (iVar2 == 0) {
        uVar11 = 0;
        while (__n = uVar11,
              sVar8 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)(local_350 + 0x11)),
              uVar11 < sVar8) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_350 + 0x11),__n);
          vVar10 = *pvVar3;
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](&local_490,__n);
          pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (local_358,(long)vVar10);
          local_300 = pvVar5;
          local_2f8 = pvVar4;
          if (pvVar4 != pvVar5) {
            if (pvVar5->refcount != (int *)0x0) {
              piVar6 = pvVar5->refcount;
              local_304 = 1;
              LOCK();
              local_308 = *piVar6;
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            local_f0 = pvVar4;
            if (pvVar4->refcount != (int *)0x0) {
              piVar6 = pvVar4->refcount;
              local_f4 = 0xffffffff;
              LOCK();
              local_f8 = *piVar6;
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (local_f8 == 1) {
                if (pvVar4->allocator == (Allocator *)0x0) {
                  local_78 = pvVar4->data;
                  if (local_78 != (void *)0x0) {
                    free(local_78);
                  }
                }
                else {
                  (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
                }
              }
            }
            pvVar4->data = (void *)0x0;
            pvVar4->elemsize = 0;
            pvVar4->elempack = 0;
            pvVar4->dims = 0;
            pvVar4->w = 0;
            pvVar4->h = 0;
            pvVar4->d = 0;
            pvVar4->c = 0;
            pvVar4->cstep = 0;
            pvVar4->refcount = (int *)0x0;
            pvVar4->data = local_300->data;
            pvVar4->refcount = local_300->refcount;
            pvVar4->elemsize = local_300->elemsize;
            pvVar4->elempack = local_300->elempack;
            pvVar4->allocator = local_300->allocator;
            pvVar4->dims = local_300->dims;
            pvVar4->w = local_300->w;
            pvVar4->h = local_300->h;
            pvVar4->d = local_300->d;
            pvVar4->c = local_300->c;
            pvVar4->cstep = local_300->cstep;
          }
          local_2f0 = pvVar4;
          uVar11 = __n + 1;
        }
LAB_0017a1d3:
        if ((*local_360 & 1) != 0) {
          for (local_558 = 0;
              sVar8 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)(local_350 + 0xe)),
              local_558 < sVar8; local_558 = local_558 + 1) {
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_350 + 0xe),local_558);
            pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_358,(long)*pvVar3);
            local_d0 = pvVar5;
            if (pvVar5->refcount != (int *)0x0) {
              piVar6 = pvVar5->refcount;
              local_d4 = 0xffffffff;
              LOCK();
              local_d8 = *piVar6;
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (local_d8 == 1) {
                if (pvVar5->allocator == (Allocator *)0x0) {
                  local_88 = pvVar5->data;
                  if (local_88 != (void *)0x0) {
                    free(local_88);
                  }
                }
                else {
                  (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                }
              }
            }
            pvVar5->data = (void *)0x0;
            pvVar5->elemsize = 0;
            pvVar5->elempack = 0;
            pvVar5->dims = 0;
            pvVar5->w = 0;
            pvVar5->h = 0;
            pvVar5->d = 0;
            pvVar5->c = 0;
            pvVar5->cstep = 0;
            pvVar5->refcount = (int *)0x0;
          }
        }
        local_410 = 0;
      }
      else {
        local_410 = 1;
        local_33c = iVar2;
      }
    }
LAB_0017a36d:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffff910);
    goto joined_r0x0017a383;
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 0xe),0);
  iVar2 = (int)in_RCX;
  local_364 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(local_350 + 0x11),0);
  local_368 = *pvVar3;
  local_370 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                        (local_358,(long)local_364);
  local_338 = &local_3b8;
  local_3b8.data = (void *)0x0;
  local_3b8.refcount = (int *)0x0;
  local_3b8.elemsize = 0;
  local_3b8.elempack = 0;
  local_3b8.allocator = (Allocator *)0x0;
  local_3b8.dims = 0;
  local_3b8.w = 0;
  local_3b8.h = 0;
  local_3b8.d = 0;
  local_3b8.c = 0;
  local_3b8.cstep = 0;
  if ((((*local_360 & 1) == 0) || ((*(byte *)((long)local_350 + 9) & 1) == 0)) ||
     (*local_370->refcount == 1)) {
LAB_001780b9:
    if (local_3b8.dims == 0) {
      local_260 = local_370;
      local_258 = &local_3b8;
      local_250 = &local_3b8;
      if (&local_3b8 != local_370) {
        if (local_370->refcount != (int *)0x0) {
          piVar6 = local_370->refcount;
          local_264 = 1;
          LOCK();
          local_268 = *piVar6;
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        local_140 = &local_3b8;
        if (local_3b8.refcount != (int *)0x0) {
          local_144 = 0xffffffff;
          LOCK();
          local_148 = *local_3b8.refcount;
          *local_3b8.refcount = *local_3b8.refcount + -1;
          UNLOCK();
          if (local_148 == 1) {
            if (local_3b8.allocator == (Allocator *)0x0) {
              local_50 = local_3b8.data;
              if (local_3b8.data != (void *)0x0) {
                free(local_3b8.data);
              }
            }
            else {
              (*(local_3b8.allocator)->_vptr_Allocator[3])(local_3b8.allocator,local_3b8.data);
            }
          }
        }
        local_3b8.data = local_260->data;
        local_3b8.refcount = local_260->refcount;
        local_3b8.elemsize = local_260->elemsize;
        local_3b8.elempack = local_260->elempack;
        local_3b8.allocator = local_260->allocator;
        local_3b8.w = local_260->w;
        local_3b8.h = local_260->h;
        local_3b8.d = local_260->d;
        local_3b8.c = local_260->c;
        local_3b8.cstep = local_260->cstep;
      }
    }
    local_414 = convert_layout((NetPrivate *)
                               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
                               in_stack_fffffffffffffae8,
                               (Layer *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0
                                                ),(Option *)in_stack_fffffffffffffad8);
    if (local_414 == 0) {
      if (((*local_360 & 1) == 0) || ((*(byte *)((long)local_350 + 9) & 1) == 0)) {
        local_330 = &local_470;
        local_470.data = (void *)0x0;
        local_470.refcount = (int *)0x0;
        local_470.elemsize = 0;
        local_470.elempack = 0;
        local_470.allocator = (Allocator *)0x0;
        local_470.dims = 0;
        local_470.w = 0;
        local_470.h = 0;
        local_470.d = 0;
        local_470.c = 0;
        local_470.cstep = 0;
        local_474 = (**(code **)(*local_350 + 0x38))(local_350,&local_3b8,&local_470,local_360);
        if (local_474 == 0) {
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (local_358,(long)local_368);
          local_2a0 = &local_470;
          local_298 = pvVar5;
          if (pvVar5 != local_2a0) {
            if (local_470.refcount != (int *)0x0) {
              local_2a4 = 1;
              LOCK();
              local_2a8 = *local_470.refcount;
              *local_470.refcount = *local_470.refcount + 1;
              UNLOCK();
            }
            local_120 = pvVar5;
            if (pvVar5->refcount != (int *)0x0) {
              piVar6 = pvVar5->refcount;
              local_124 = 0xffffffff;
              LOCK();
              local_128 = *piVar6;
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (local_128 == 1) {
                if (pvVar5->allocator == (Allocator *)0x0) {
                  local_60 = pvVar5->data;
                  if (local_60 != (void *)0x0) {
                    free(local_60);
                  }
                }
                else {
                  (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                }
              }
            }
            pvVar5->data = (void *)0x0;
            pvVar5->elemsize = 0;
            pvVar5->elempack = 0;
            pvVar5->dims = 0;
            pvVar5->w = 0;
            pvVar5->h = 0;
            pvVar5->d = 0;
            pvVar5->c = 0;
            pvVar5->cstep = 0;
            pvVar5->refcount = (int *)0x0;
            pvVar5->data = local_2a0->data;
            pvVar5->refcount = local_2a0->refcount;
            pvVar5->elemsize = local_2a0->elemsize;
            pvVar5->elempack = local_2a0->elempack;
            pvVar5->allocator = local_2a0->allocator;
            pvVar5->dims = local_2a0->dims;
            pvVar5->w = local_2a0->w;
            pvVar5->h = local_2a0->h;
            pvVar5->d = local_2a0->d;
            pvVar5->c = local_2a0->c;
            pvVar5->cstep = local_2a0->cstep;
          }
          local_410 = 0;
          local_290 = pvVar5;
        }
        else {
          local_410 = 1;
          local_33c = local_474;
        }
        local_218 = &local_470;
        local_180 = local_218;
        if (local_470.refcount != (int *)0x0) {
          local_184 = 0xffffffff;
          LOCK();
          local_188 = *local_470.refcount;
          *local_470.refcount = *local_470.refcount + -1;
          UNLOCK();
          if (local_188 == 1) {
            if (local_470.allocator == (Allocator *)0x0) {
              local_30 = local_470.data;
              if (local_470.data != (void *)0x0) {
                free(local_470.data);
              }
            }
            else {
              (*(local_470.allocator)->_vptr_Allocator[3])(local_470.allocator,local_470.data);
            }
          }
        }
        local_470.data = (void *)0x0;
        local_470.elemsize = 0;
        local_470.elempack = 0;
        local_470.dims = 0;
        local_470.w = 0;
        local_470.h = 0;
        local_470.d = 0;
        local_470.c = 0;
        local_470.cstep = 0;
        local_470.refcount = (int *)0x0;
        if (local_410 == 0) goto LAB_00178c12;
      }
      else {
        local_420 = &local_3b8;
        local_424 = (**(code **)(*local_350 + 0x48))(local_350,local_420,local_360);
        pvVar5 = local_420;
        if (local_424 == 0) {
          pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             (local_358,(long)local_368);
          local_280 = pvVar5;
          local_278 = pvVar4;
          local_270 = pvVar4;
          if (pvVar4 != pvVar5) {
            if (pvVar5->refcount != (int *)0x0) {
              piVar6 = pvVar5->refcount;
              local_284 = 1;
              LOCK();
              local_288 = *piVar6;
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            local_130 = pvVar4;
            if (pvVar4->refcount != (int *)0x0) {
              piVar6 = pvVar4->refcount;
              local_134 = 0xffffffff;
              LOCK();
              local_138 = *piVar6;
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (local_138 == 1) {
                if (pvVar4->allocator == (Allocator *)0x0) {
                  local_58 = pvVar4->data;
                  if (local_58 != (void *)0x0) {
                    free(local_58);
                  }
                }
                else {
                  (*pvVar4->allocator->_vptr_Allocator[3])(pvVar4->allocator,pvVar4->data);
                }
              }
            }
            pvVar4->data = (void *)0x0;
            pvVar4->elemsize = 0;
            pvVar4->elempack = 0;
            pvVar4->dims = 0;
            pvVar4->w = 0;
            pvVar4->h = 0;
            pvVar4->d = 0;
            pvVar4->c = 0;
            pvVar4->cstep = 0;
            pvVar4->refcount = (int *)0x0;
            pvVar4->data = local_280->data;
            pvVar4->refcount = local_280->refcount;
            pvVar4->elemsize = local_280->elemsize;
            pvVar4->elempack = local_280->elempack;
            pvVar4->allocator = local_280->allocator;
            pvVar4->dims = local_280->dims;
            pvVar4->w = local_280->w;
            pvVar4->h = local_280->h;
            pvVar4->d = local_280->d;
            pvVar4->c = local_280->c;
            pvVar4->cstep = local_280->cstep;
          }
LAB_00178c12:
          if ((*local_360 & 1) != 0) {
            pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                               (local_358,(long)local_364);
            local_b0 = pvVar5;
            if (pvVar5->refcount != (int *)0x0) {
              piVar6 = pvVar5->refcount;
              local_b4 = 0xffffffff;
              LOCK();
              local_b8 = *piVar6;
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (local_b8 == 1) {
                if (pvVar5->allocator == (Allocator *)0x0) {
                  local_98 = pvVar5->data;
                  if (local_98 != (void *)0x0) {
                    free(local_98);
                  }
                }
                else {
                  (*pvVar5->allocator->_vptr_Allocator[3])(pvVar5->allocator,pvVar5->data);
                }
              }
            }
            pvVar5->data = (void *)0x0;
            pvVar5->elemsize = 0;
            pvVar5->elempack = 0;
            pvVar5->dims = 0;
            pvVar5->w = 0;
            pvVar5->h = 0;
            pvVar5->d = 0;
            pvVar5->c = 0;
            pvVar5->cstep = 0;
            pvVar5->refcount = (int *)0x0;
          }
          local_410 = 0;
        }
        else {
          local_410 = 1;
          local_33c = local_424;
        }
      }
    }
    else {
      local_410 = 1;
      local_33c = local_414;
    }
  }
  else {
    Mat::clone(&local_400,(__fn *)local_370,*(void **)(local_360 + 8),iVar2,in_R8);
    local_240 = &local_400;
    local_238 = &local_3b8;
    if (&local_3b8 != local_240) {
      if (local_400.refcount != (int *)0x0) {
        local_244 = 1;
        LOCK();
        local_248 = *local_400.refcount;
        *local_400.refcount = *local_400.refcount + 1;
        UNLOCK();
      }
      local_150 = &local_3b8;
      if (local_3b8.refcount != (int *)0x0) {
        local_154 = 0xffffffff;
        LOCK();
        local_158 = *local_3b8.refcount;
        *local_3b8.refcount = *local_3b8.refcount + -1;
        UNLOCK();
        if (local_158 == 1) {
          if (local_3b8.allocator == (Allocator *)0x0) {
            local_48 = local_3b8.data;
            if (local_3b8.data != (void *)0x0) {
              free(local_3b8.data);
            }
          }
          else {
            (*(local_3b8.allocator)->_vptr_Allocator[3])(local_3b8.allocator,local_3b8.data);
          }
        }
      }
      local_3b8.data = (void *)0x0;
      local_3b8.elemsize = 0;
      local_3b8.elempack = 0;
      local_3b8.w = 0;
      local_3b8.h = 0;
      local_3b8.d = 0;
      local_3b8.c = 0;
      local_3b8.cstep = 0;
      local_3b8.refcount = (int *)0x0;
      local_3b8.data = local_240->data;
      local_3b8.refcount = local_240->refcount;
      local_3b8.elemsize = local_240->elemsize;
      local_3b8.elempack = local_240->elempack;
      local_3b8.allocator = local_240->allocator;
      local_3b8.dims = local_240->dims;
      local_3b8.w = local_240->w;
      local_3b8.h = local_240->h;
      local_3b8.d = local_240->d;
      local_3b8.c = local_240->c;
      local_3b8.cstep = local_240->cstep;
    }
    local_228 = &local_400;
    local_230 = &local_3b8;
    local_160 = local_228;
    if (local_400.refcount != (int *)0x0) {
      local_164 = 0xffffffff;
      LOCK();
      local_168 = *local_400.refcount;
      *local_400.refcount = *local_400.refcount + -1;
      UNLOCK();
      if (local_168 == 1) {
        if (local_400.allocator == (Allocator *)0x0) {
          if (local_400.data != (void *)0x0) {
            free(local_400.data);
          }
        }
        else {
          (*(local_400.allocator)->_vptr_Allocator[3])(local_400.allocator,local_400.data);
        }
      }
    }
    local_400.data = (void *)0x0;
    local_400.elemsize = 0;
    local_400.elempack = 0;
    local_400.dims = 0;
    local_400.w = 0;
    local_400.h = 0;
    local_400.d = 0;
    local_400.c = 0;
    local_400.cstep = 0;
    local_400.refcount = (int *)0x0;
    local_1e0 = &local_3b8;
    if (local_3b8.data != (void *)0x0) {
      local_a8 = local_1e0;
    }
    if (local_3b8.data != (void *)0x0 && local_3b8.cstep * (long)local_3b8.c != 0)
    goto LAB_001780b9;
    local_33c = -100;
    local_410 = 1;
  }
  local_208 = &local_3b8;
  if (local_3b8.refcount != (int *)0x0) {
    local_1a4 = 0xffffffff;
    LOCK();
    local_1a8 = *local_3b8.refcount;
    *local_3b8.refcount = *local_3b8.refcount + -1;
    UNLOCK();
    if (local_1a8 == 1) {
      local_1a0 = local_208;
      if (local_3b8.allocator == (Allocator *)0x0) {
        local_20 = local_3b8.data;
        if (local_3b8.data != (void *)0x0) {
          free(local_3b8.data);
        }
      }
      else {
        (*(local_3b8.allocator)->_vptr_Allocator[3])(local_3b8.allocator,local_3b8.data);
      }
    }
  }
joined_r0x0017a383:
  if (local_410 == 0) {
    local_33c = 0;
  }
  return local_33c;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
                if (bottom_blob.empty())
                    return -100;
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        int ret = convert_layout(bottom_blob, layer, opt);
        if (ret != 0)
            return ret;

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                    if (bottom_blobs[i].empty())
                        return -100;
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            int ret = convert_layout(bottom_blobs[i], layer, opt);
            if (ret != 0)
                return ret;
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        if (opt.lightmode)
        {
            for (size_t i = 0; i < layer->bottoms.size(); i++)
            {
                int bottom_blob_index = layer->bottoms[i];

                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}